

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_> *
__thiscall
spvtools::opt::Module::GetConstants
          (vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
           *__return_storage_ptr__,Module *this)

{
  Instruction *pIVar1;
  bool bVar2;
  Instruction *in_RAX;
  Instruction *inst;
  Instruction *local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pIVar1 = &(this->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  local_28 = in_RAX;
  while (pIVar1 = *(Instruction **)
                   ((long)&pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8),
        pIVar1 != &(this->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_)
  {
    bVar2 = IsConstantInst(pIVar1->opcode_);
    if (bVar2) {
      local_28 = pIVar1;
      std::
      vector<spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>>::
      emplace_back<spvtools::opt::Instruction_const*>
                ((vector<spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>>
                  *)__return_storage_ptr__,&local_28);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const Instruction*> Module::GetConstants() const {
  std::vector<const Instruction*> const_insts;
  for (auto& inst : types_values_) {
    if (IsConstantInst(inst.opcode())) const_insts.push_back(&inst);
  }
  return const_insts;
}